

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageRename(Fts5Storage *pStorage,char *zName)

{
  long lVar1;
  int iVar2;
  char *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  Fts5Config *pConfig;
  int rc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  char *zName_00;
  undefined4 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  zName_00 = *(char **)in_RDI;
  iVar2 = sqlite3Fts5StorageSync
                    ((Fts5Storage *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  fts5StorageRenameOne
            ((Fts5Config *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_RDI,in_RSI,zName_00);
  fts5StorageRenameOne
            ((Fts5Config *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_RDI,in_RSI,zName_00);
  fts5StorageRenameOne
            ((Fts5Config *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_RDI,in_RSI,zName_00);
  if (*(int *)(zName_00 + 0x68) != 0) {
    fts5StorageRenameOne
              ((Fts5Config *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_RDI,in_RSI,zName_00);
  }
  if (*(int *)(zName_00 + 0x48) == 0) {
    fts5StorageRenameOne
              ((Fts5Config *)CONCAT44(iVar2,in_stack_fffffffffffffff0),in_RDI,in_RSI,zName_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5StorageRename(Fts5Storage *pStorage, const char *zName){
  Fts5Config *pConfig = pStorage->pConfig;
  int rc = sqlite3Fts5StorageSync(pStorage);

  fts5StorageRenameOne(pConfig, &rc, "data", zName);
  fts5StorageRenameOne(pConfig, &rc, "idx", zName);
  fts5StorageRenameOne(pConfig, &rc, "config", zName);
  if( pConfig->bColumnsize ){
    fts5StorageRenameOne(pConfig, &rc, "docsize", zName);
  }
  if( pConfig->eContent==FTS5_CONTENT_NORMAL ){
    fts5StorageRenameOne(pConfig, &rc, "content", zName);
  }
  return rc;
}